

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

bool __thiscall
QListModel::moveRows
          (QListModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < sourceRow) {
    iVar3 = (**(code **)(*(long *)this + 0x78))();
    bVar1 = false;
    if ((destinationChild < 0) || (iVar3 < count + sourceRow)) goto LAB_0051ffaf;
    iVar3 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
    bVar1 = false;
    if ((sourceRow == destinationChild) || (iVar3 < destinationChild)) goto LAB_0051ffaf;
    if (0 < count && destinationChild + -1 != sourceRow) {
      bVar1 = QModelIndex::isValid(sourceParent);
      if (!bVar1) {
        bVar1 = QModelIndex::isValid(destinationParent);
        if (!bVar1) {
          local_50 = 0xffffffffffffffff;
          local_48 = 0;
          uStack_40 = 0;
          local_68 = 0xffffffffffffffff;
          local_60 = 0;
          uStack_58 = 0;
          cVar2 = QAbstractItemModel::beginMoveRows
                            ((QModelIndex *)this,(int)&local_50,sourceRow,
                             (QModelIndex *)(ulong)((count + sourceRow) - 1),(int)&local_68);
          bVar1 = false;
          if (cVar2 != '\0') {
            iVar3 = destinationChild + -1;
            if ((uint)destinationChild < (uint)sourceRow) {
              iVar3 = destinationChild;
            }
            iVar4 = 0;
            if ((uint)destinationChild < (uint)sourceRow) {
              iVar4 = count + -1;
            }
            while (bVar1 = count != 0, count = count + -1, bVar1) {
              QList<QListWidgetItem_*>::move
                        (&this->items,(ulong)(uint)(iVar4 + sourceRow),(long)iVar3);
            }
            QAbstractItemModel::endMoveRows();
            bVar1 = true;
          }
          goto LAB_0051ffaf;
        }
      }
    }
  }
  bVar1 = false;
LAB_0051ffaf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(QModelIndex(), sourceRow, sourceRow + count - 1, QModelIndex(), destinationChild))
        return false;

    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        items.move(fromRow, destinationChild);
    endMoveRows();
    return true;
}